

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

void __thiscall
QTextDocumentLayoutPrivate::drawFrame
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextFrame *frame)

{
  QRectF *clip;
  QFixed *pQVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  QPointer<QTextFrame> *pQVar8;
  QFixed *pQVar9;
  uint uVar10;
  uint uVar11;
  Iterator it;
  QRectF cellRect;
  QRectF cellRect_00;
  qreal qVar12;
  QFixed *pQVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  QTextFrameData *fd;
  long lVar20;
  QTextTable *this_00;
  QTextTableData *this_01;
  QTextTable *pQVar21;
  QTextFrame *pQVar22;
  QTextFrameLayoutData *data;
  QPen *p;
  QBrush *pQVar23;
  QTextLayout *this_02;
  uint uVar24;
  int col;
  int iVar25;
  long lVar26;
  long lVar27;
  QFixed *pQVar28;
  undefined8 *puVar29;
  PaintContext *pPVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  int c;
  QTextCursor *this_03;
  int r;
  ulong uVar34;
  long in_FS_OFFSET;
  byte bVar35;
  double dVar36;
  double dVar38;
  undefined1 auVar37 [16];
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QSizeF QVar42;
  uint local_588;
  int col_start;
  undefined4 uStack_544;
  double dStack_540;
  undefined4 local_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  int num_cols;
  QRectF local_518;
  QPointF local_4f8;
  QPointF local_4e8;
  QPointF local_4d8;
  int row_start;
  undefined4 uStack_4c4;
  QPalette QStack_4c0;
  int local_4b0;
  undefined4 uStack_4ac;
  qreal qStack_4a8;
  qreal local_4a0;
  qreal qStack_498;
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection> local_490;
  int num_rows;
  undefined4 uStack_474;
  int iStack_470;
  undefined4 uStack_46c;
  QTextBlock local_468;
  QVarLengthArray<int,_256LL> selectedTableCells;
  
  bVar35 = 0;
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  fd = (QTextFrameData *)QTextFrame::layoutData(frame);
  if (fd == (QTextFrameData *)0x0) {
    lVar20 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (lVar20 == 0) {
      fd = (QTextFrameData *)operator_new(0x78);
      (fd->super_QTextFrameLayoutData)._vptr_QTextFrameLayoutData =
           (_func_int **)&PTR__QTextFrameData_007edfd0;
      (fd->position).x = 0;
      (fd->position).y = 0;
      (fd->size).width = 0;
      (fd->size).height = 0;
      fd->topMargin = 0;
      fd->bottomMargin = 0;
      fd->leftMargin = 0;
      fd->rightMargin = 0;
      fd->border = 0;
      fd->padding = 0;
      fd->contentsWidth = 0;
      fd->contentsHeight = 0;
      fd->oldContentsWidth = 0;
      fd->effectiveTopMargin = 0;
      fd->effectiveBottomMargin = 0;
      fd->minimumWidth = 0;
      (fd->maximumWidth).val = 0x1fffffc0;
      fd->currentLayoutStruct = (QTextLayoutStruct *)0x0;
      fd->sizeDirty = true;
      fd->layoutDirty = true;
      (fd->floats).d.d = (Data *)0x0;
      (fd->floats).d.ptr = (QPointer<QTextFrame> *)0x0;
      (fd->floats).d.size = 0;
    }
    else {
      fd = (QTextFrameData *)operator_new(0x160);
      (fd->position).x = 0;
      (fd->position).y = 0;
      (fd->size).width = 0;
      (fd->size).height = 0;
      fd->topMargin = 0;
      fd->bottomMargin = 0;
      fd->leftMargin = 0;
      fd->rightMargin = 0;
      fd->border = 0;
      fd->padding = 0;
      fd->contentsWidth = 0;
      fd->contentsHeight = 0;
      fd->oldContentsWidth = 0;
      fd->effectiveTopMargin = 0;
      fd->effectiveBottomMargin = 0;
      fd->minimumWidth = 0;
      (fd->maximumWidth).val = 0x1fffffc0;
      fd->currentLayoutStruct = (QTextLayoutStruct *)0x0;
      fd->sizeDirty = true;
      fd->layoutDirty = true;
      (fd->floats).d.d = (Data *)0x0;
      (fd->floats).d.ptr = (QPointer<QTextFrame> *)0x0;
      *(undefined1 (*) [16])&(fd->floats).d.size = (undefined1  [16])0x0;
      (fd->super_QTextFrameLayoutData)._vptr_QTextFrameLayoutData =
           (_func_int **)&PTR__QTextTableData_007ee180;
      fd[2].floats.d.d = (Data *)0x0;
      fd[2].floats.d.ptr = (QPointer<QTextFrame> *)0x0;
      memset(&fd[1].size,0,0xc0);
    }
    QTextFrame::setLayoutData(frame,&fd->super_QTextFrameLayoutData);
  }
  selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s =
       CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_,
                (int)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s);
  selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr =
       (void *)CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_,
                        (ColorGroup)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr);
  if (fd->layoutDirty == false) {
    dVar36 = offset->xp + (double)(fd->position).x.val * 0.015625;
    dVar38 = offset->yp + (double)(fd->position).y.val * 0.015625;
    auVar37._0_8_ = (double)((ulong)dVar36 & 0x8000000000000000 | 0x3fe0000000000000) + dVar36;
    auVar37._8_8_ = (double)((ulong)dVar38 & 0x8000000000000000 | 0x3fe0000000000000) + dVar38;
    auVar37 = minpd(_DAT_00684790,auVar37);
    auVar37 = maxpd(auVar37,_DAT_006847a0);
    local_4d8.xp = (qreal)(int)auVar37._0_8_;
    local_4d8.yp = (qreal)(int)auVar37._8_8_;
    clip = &context->clip;
    dVar36 = (context->clip).w;
    if (((dVar36 <= 0.0) || (dVar38 = (context->clip).h, dVar38 <= 0.0)) ||
       ((dVar2 = (context->clip).yp,
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s =
             CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_,
                      (int)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s),
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr =
             (void *)CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_,
                              (ColorGroup)
                              selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr),
        local_4d8.yp <= dVar38 + dVar2 &&
        (((selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s =
                CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_,
                         (int)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s),
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr =
               (void *)CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_,
                                (ColorGroup)
                                selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr),
          dVar2 <= (double)(fd->size).height.val * 0.015625 + local_4d8.yp &&
          (selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s =
                CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_,
                         (int)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s),
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr =
               (void *)CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_,
                                (ColorGroup)
                                selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr),
          local_4d8.xp <= dVar36 + clip->xp)) &&
         (selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s =
               CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_,
                        (int)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s),
         selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr =
              (void *)CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_,
                               (ColorGroup)
                               selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr),
         clip->xp <= (double)(fd->size).width.val * 0.015625 + local_4d8.xp)))))) {
      lcDraw();
      if (((byte)lcDraw::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._0_4_ = 2;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_ = 0;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._0_4_ = 0;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_ = 0;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._0_4_ = 0;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_ = 0;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array._0_4_ =
             SUB84(lcDraw::category.name,0);
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array._4_4_ =
             SUB84((ulong)lcDraw::category.name >> 0x20,0);
        QMessageLogger::debug();
        qVar12 = local_518.xp;
        QVar39.m_data = (storage_type *)0x9;
        QVar39.m_size = (qsizetype)&row_start;
        QString::fromUtf8(QVar39);
        QTextStream::operator<<((QTextStream *)qVar12,(QString *)&row_start);
        if (_row_start != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)_row_start = *(int *)_row_start + -1;
          UNLOCK();
          if (*(int *)_row_start == 0) {
            QArrayData::deallocate((QArrayData *)_row_start,2,0x10);
          }
        }
        if (*(QTextStream *)((long)local_518.xp + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_518.xp,' ');
        }
        iVar15 = QTextFrame::firstPosition(frame);
        QTextStream::operator<<((QTextStream *)local_518.xp,iVar15);
        if (*(QTextStream *)((long)local_518.xp + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_518.xp,' ');
        }
        qVar12 = local_518.xp;
        QVar40.m_data = (storage_type *)0x2;
        QVar40.m_size = (qsizetype)&row_start;
        QString::fromUtf8(QVar40);
        QTextStream::operator<<((QTextStream *)qVar12,(QString *)&row_start);
        if (_row_start != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)_row_start = *(int *)_row_start + -1;
          UNLOCK();
          if (*(int *)_row_start == 0) {
            QArrayData::deallocate((QArrayData *)_row_start,2,0x10);
          }
        }
        if (*(QTextStream *)((long)local_518.xp + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_518.xp,' ');
        }
        iVar15 = QTextFrame::lastPosition(frame);
        QTextStream::operator<<((QTextStream *)local_518.xp,iVar15);
        if (*(QTextStream *)((long)local_518.xp + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_518.xp,' ');
        }
        qVar12 = local_518.xp;
        QVar41.m_data = (storage_type *)0x2;
        QVar41.m_size = (qsizetype)&row_start;
        QString::fromUtf8(QVar41);
        QTextStream::operator<<((QTextStream *)qVar12,(QString *)&row_start);
        if (_row_start != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)_row_start = *(int *)_row_start + -1;
          UNLOCK();
          if (*(int *)_row_start == 0) {
            QArrayData::deallocate((QArrayData *)_row_start,2,0x10);
          }
        }
        if (*(QTextStream *)((long)local_518.xp + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_518.xp,' ');
        }
        local_4e8.xp = local_518.xp;
        *(int *)((long)local_518.xp + 0x28) = *(int *)((long)local_518.xp + 0x28) + 1;
        ::operator<<((QDebug *)&local_4e8.yp,&local_4e8);
        QDebug::~QDebug((QDebug *)&local_4e8.yp);
        QDebug::~QDebug((QDebug *)&local_4e8);
        QDebug::~QDebug((QDebug *)&local_518);
      }
      local_468.p = (QTextDocumentPrivate *)0x0;
      local_468.n = 0;
      local_468._12_4_ = 0xaaaaaaaa;
      local_4f8.xp = local_4d8.xp;
      local_4f8.yp = local_4d8.yp;
      this_00 = (QTextTable *)QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
      local_518.xp = local_4d8.xp;
      local_518.yp = local_4d8.yp;
      local_518.w = (double)(fd->size).width.val * 0.015625;
      local_518.h = (double)(fd->size).height.val * 0.015625;
      if (this_00 == (QTextTable *)0x0) {
        drawFrameDecoration(this,painter,frame,fd,clip,&local_518);
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._0_4_ = 0xaaaaaaaa;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_ = 0xaaaaaaaa;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[0] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[1] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[2] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[3] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[4] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[5] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[6] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[7] = -0x56;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._0_4_ = 0xaaaaaaaa;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_ = 0xaaaaaaaa;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._0_4_ = -0x55555556;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_ = -0x55555556;
        QTextFrame::begin((iterator *)&selectedTableCells,frame);
        pQVar22 = QTextDocumentPrivate::rootFrame
                            ((this->super_QAbstractTextDocumentLayoutPrivate).docPrivate);
        if (pQVar22 == frame) {
          frameIteratorForYPosition
                    ((Iterator *)&row_start,this,(QFixed)(int)((context->clip).yp * 64.0));
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._0_4_ =
               QStack_4c0.currentGroup;
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_ = QStack_4c0._12_4_;
          selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[0] = (undefined1)local_4b0;
          selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[1] = local_4b0._1_1_;
          selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[2] = local_4b0._2_1_;
          selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[3] = local_4b0._3_1_;
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._0_4_ = row_start;
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_ = row_start._4_4_;
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._0_4_ = (int)QStack_4c0.d;
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_ = QStack_4c0.d._4_4_;
        }
        _row_start = (totally_ordered_wrapper<QTextFormatPrivate_*>)(QTextFormatPrivate *)0x0;
        QStack_4c0.d._0_4_ = 0;
        QStack_4c0.d._4_4_ = 0;
        QStack_4c0.currentGroup = Active;
        QStack_4c0._12_4_ = 0;
        uVar16 = (uint)(fd->floats).d.size;
        QList<QTextFrame_*>::reserve((QList<QTextFrame_*> *)&row_start,(long)(int)uVar16);
        if (0 < (int)uVar16) {
          uVar34 = (ulong)(uVar16 & 0x7fffffff);
          lVar20 = 8;
          do {
            pQVar8 = (fd->floats).d.ptr;
            lVar26 = *(long *)((long)pQVar8 + lVar20 + -8);
            if ((lVar26 == 0) || (*(int *)(lVar26 + 4) == 0)) {
              _col_start = (QTextFrame *)0x0;
            }
            else {
              _col_start = *(QTextFrame **)((long)&(pQVar8->wp).d + lVar20);
            }
            QtPrivate::QPodArrayOps<QTextFrame*>::emplace<QTextFrame*&>
                      ((QPodArrayOps<QTextFrame*> *)&row_start,
                       CONCAT44(QStack_4c0._12_4_,QStack_4c0.currentGroup),(QTextFrame **)&col_start
                      );
            QList<QTextFrame_*>::end((QList<QTextFrame_*> *)&row_start);
            lVar20 = lVar20 + 0x10;
            uVar34 = uVar34 - 1;
          } while (uVar34 != 0);
        }
        it.cf._4_4_ = selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_;
        it.cf._0_4_ = (ColorGroup)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr;
        it._28_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[4];
        it._29_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[5];
        it._30_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[6];
        it._31_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[7];
        it.cb._0_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[0];
        it.cb._1_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[1];
        it.cb._2_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[2];
        it.cb._3_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[3];
        it.f._4_4_ = selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_;
        it.f._0_4_ = (undefined4)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a;
        it.b = (int)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s;
        it.e = selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_;
        drawFlow(this,&local_4d8,painter,context,it,(QList<QTextFrame_*> *)&row_start,&local_468);
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s =
             CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_,
                      (int)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s);
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr =
             (undefined1 *)
             CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_,
                      (ColorGroup)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr);
        if (_row_start != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)_row_start = *(int *)_row_start + -1;
          UNLOCK();
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s =
               CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_,
                        (int)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s);
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr =
               (undefined1 *)
               CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_,
                        (ColorGroup)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr);
          if (*(int *)_row_start == 0) {
            QArrayData::deallocate((QArrayData *)_row_start,8,0x10);
          }
        }
      }
      else {
        uVar16 = QTextTable::rows(this_00);
        iVar15 = QTextTable::columns(this_00);
        this_01 = (QTextTableData *)QTextFrame::layoutData((QTextFrame *)this_00);
        if (this_01 == (QTextTableData *)0x0) {
          lVar20 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (lVar20 == 0) {
            this_01 = (QTextTableData *)operator_new(0x78);
            (this_01->super_QTextFrameData).super_QTextFrameLayoutData._vptr_QTextFrameLayoutData =
                 (_func_int **)&PTR__QTextFrameData_007edfd0;
            (this_01->super_QTextFrameData).position.x = 0;
            (this_01->super_QTextFrameData).position.y = 0;
            (this_01->super_QTextFrameData).size.width = 0;
            (this_01->super_QTextFrameData).size.height = 0;
            (this_01->super_QTextFrameData).topMargin = 0;
            (this_01->super_QTextFrameData).bottomMargin = 0;
            (this_01->super_QTextFrameData).leftMargin = 0;
            (this_01->super_QTextFrameData).rightMargin = 0;
            (this_01->super_QTextFrameData).border = 0;
            (this_01->super_QTextFrameData).padding = 0;
            (this_01->super_QTextFrameData).contentsWidth = 0;
            (this_01->super_QTextFrameData).contentsHeight = 0;
            (this_01->super_QTextFrameData).oldContentsWidth = 0;
            (this_01->super_QTextFrameData).effectiveTopMargin = 0;
            (this_01->super_QTextFrameData).effectiveBottomMargin = 0;
            (this_01->super_QTextFrameData).minimumWidth = 0;
            (this_01->super_QTextFrameData).maximumWidth.val = 0x1fffffc0;
            (this_01->super_QTextFrameData).currentLayoutStruct = (QTextLayoutStruct *)0x0;
            (this_01->super_QTextFrameData).sizeDirty = true;
            (this_01->super_QTextFrameData).layoutDirty = true;
            (this_01->super_QTextFrameData).floats.d.d = (Data *)0x0;
            (this_01->super_QTextFrameData).floats.d.ptr = (QPointer<QTextFrame> *)0x0;
            (this_01->super_QTextFrameData).floats.d.size = 0;
          }
          else {
            this_01 = (QTextTableData *)operator_new(0x160);
            (this_01->super_QTextFrameData).position.x = 0;
            (this_01->super_QTextFrameData).position.y = 0;
            (this_01->super_QTextFrameData).size.width = 0;
            (this_01->super_QTextFrameData).size.height = 0;
            (this_01->super_QTextFrameData).topMargin = 0;
            (this_01->super_QTextFrameData).bottomMargin = 0;
            (this_01->super_QTextFrameData).leftMargin = 0;
            (this_01->super_QTextFrameData).rightMargin = 0;
            (this_01->super_QTextFrameData).border = 0;
            (this_01->super_QTextFrameData).padding = 0;
            (this_01->super_QTextFrameData).contentsWidth = 0;
            (this_01->super_QTextFrameData).contentsHeight = 0;
            (this_01->super_QTextFrameData).oldContentsWidth = 0;
            (this_01->super_QTextFrameData).effectiveTopMargin = 0;
            (this_01->super_QTextFrameData).effectiveBottomMargin = 0;
            (this_01->super_QTextFrameData).minimumWidth = 0;
            (this_01->super_QTextFrameData).maximumWidth.val = 0x1fffffc0;
            (this_01->super_QTextFrameData).currentLayoutStruct = (QTextLayoutStruct *)0x0;
            (this_01->super_QTextFrameData).sizeDirty = true;
            (this_01->super_QTextFrameData).layoutDirty = true;
            (this_01->super_QTextFrameData).floats.d.d = (Data *)0x0;
            (this_01->super_QTextFrameData).floats.d.ptr = (QPointer<QTextFrame> *)0x0;
            (this_01->super_QTextFrameData).floats.d.size = 0;
            this_01->cellSpacing = 0;
            this_01->cellPadding = 0;
            (this_01->super_QTextFrameData).super_QTextFrameLayoutData._vptr_QTextFrameLayoutData =
                 (_func_int **)&PTR__QTextTableData_007ee180;
            (this_01->childFrameMap).d = (Data *)0x0;
            (this_01->childFrameMap).m_size = 0;
            memset(&this_01->minWidths,0,0xc0);
          }
          QTextFrame::setLayoutData((QTextFrame *)this_00,(QTextFrameLayoutData *)this_01);
        }
        memset(&selectedTableCells,0xaa,0x418);
        uVar34 = (context->selections).d.size;
        lVar20 = uVar34 * 4;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._0_4_ = 0x100;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_ = 0;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._0_4_ = 0;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_ = 0;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr =
             &selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>;
        if (0x40 < uVar34) {
          drawFrame();
        }
        if ((context->selections).d.size != 0) {
          lVar27 = 0xc;
          lVar26 = 0;
          uVar34 = 0;
          do {
            this_03 = (QTextCursor *)
                      ((long)&(((context->selections).d.ptr)->cursor).d.d.ptr + lVar26);
            row_start = 0xffffffff;
            _col_start = (QTextFrame *)CONCAT44(uStack_544,0xffffffff);
            num_rows = -1;
            num_cols = -1;
            selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s = lVar20;
            pQVar21 = QTextCursor::currentTable(this_03);
            lVar20 = selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s;
            if (pQVar21 == this_00) {
              QTextCursor::selectedTableCells(this_03,&row_start,&num_rows,&col_start,&num_cols);
              lVar20 = selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s;
            }
            *(int *)(((QVLAStorage<4UL,_4UL,_256LL> *)
                     selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr)->array +
                    lVar27 + -0xc) = row_start;
            *(int *)(((QVLAStorage<4UL,_4UL,_256LL> *)
                     selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr)->array +
                    lVar27 + -8) = col_start;
            *(int *)(((QVLAStorage<4UL,_4UL,_256LL> *)
                     selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr)->array +
                    lVar27 + -4) = num_rows;
            *(int *)(((QVLAStorage<4UL,_4UL,_256LL> *)
                     selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr)->array + lVar27)
                 = num_cols;
            uVar34 = uVar34 + 1;
            lVar26 = lVar26 + 0x18;
            lVar27 = lVar27 + 0x10;
          } while (uVar34 < (ulong)(context->selections).d.size);
        }
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s = lVar20;
        QVar42 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
        uVar17 = (uint)(QVar42.ht * 64.0);
        uVar24 = 0x1fffffc0;
        if (0 < (int)uVar17) {
          uVar24 = uVar17;
        }
        uVar17 = (this_01->super_QTextFrameData).position.y.val;
        pQVar22 = QTextFrame::parentFrame((QTextFrame *)this_00);
        while (pQVar22 != (QTextFrame *)0x0) {
          data = QTextFrame::layoutData(pQVar22);
          if (data == (QTextFrameLayoutData *)0x0) {
            lVar20 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
            if (lVar20 == 0) {
              data = (QTextFrameLayoutData *)operator_new(0x78);
              data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
              data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
              data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
              data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            }
            else {
              data = (QTextFrameLayoutData *)operator_new(0x160);
              data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
              data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
              data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
              data[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              data[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              memset(data + 0x11,0,0xc0);
            }
            QTextFrame::setLayoutData(pQVar22,data);
          }
          uVar17 = uVar17 + *(int *)((long)&data[1]._vptr_QTextFrameLayoutData + 4);
          pQVar22 = QTextFrame::parentFrame(pQVar22);
        }
        uVar10 = -uVar17;
        if (0 < (int)uVar17) {
          uVar10 = uVar17;
        }
        uVar11 = -uVar24;
        if (0 < (int)uVar24) {
          uVar11 = uVar24;
        }
        iVar25 = (int)(((ulong)uVar10 * 0x40 + (ulong)(uVar11 >> 1)) / (ulong)uVar11);
        iVar33 = -iVar25;
        if (-1 < (int)(uVar17 ^ uVar24)) {
          iVar33 = iVar25;
        }
        iVar33 = iVar33 >> 6;
        uVar17 = uVar17 + (this_01->super_QTextFrameData).size.height.val;
        uVar10 = -uVar17;
        if (0 < (int)uVar17) {
          uVar10 = uVar17;
        }
        iVar18 = (int)(((ulong)uVar10 * 0x40 + (ulong)(uVar11 >> 1)) / (ulong)uVar11);
        iVar25 = -iVar18;
        if (-1 < (int)(uVar17 ^ uVar24)) {
          iVar25 = iVar18;
        }
        if (this_01->borderCollapse == false) {
          drawFrameDecoration(this,painter,frame,fd,clip,&local_518);
        }
        QTextTable::format((QTextTable *)&row_start);
        iVar19 = QTextFormat::intProperty((QTextFormat *)&row_start,0x4104);
        iVar18 = uVar16 - 1;
        if (iVar19 < (int)(uVar16 - 1)) {
          iVar18 = iVar19;
        }
        QTextFormat::~QTextFormat((QTextFormat *)&row_start);
        iVar19 = (int)this_00;
        if (iVar33 < iVar25 >> 6) {
          do {
            iVar33 = iVar33 + 1;
            iVar3 = (this_01->super_QTextFrameData).effectiveTopMargin.val;
            iVar4 = (this_01->cellSpacing).val;
            iVar5 = (this_01->super_QTextFrameData).border.val;
            iVar6 = ((this_01->rowPositions).d.ptr)->val;
            if (0 < iVar18) {
              col = 0;
              do {
                if (0 < iVar15) {
                  c = 0;
                  do {
                    num_rows = -0x55555556;
                    uStack_474 = 0xaaaaaaaa;
                    iStack_470 = -0x55555556;
                    uStack_46c = 0xaaaaaaaa;
                    QTextTable::cellAt((QTextTable *)&num_rows,iVar19,col);
                    puVar29 = &DAT_006bc760;
                    pPVar30 = (PaintContext *)&row_start;
                    for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
                      *(undefined8 *)pPVar30 = *puVar29;
                      puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
                      pPVar30 = (PaintContext *)((long)pPVar30 + (ulong)bVar35 * -0x10 + 8);
                    }
                    row_start = context->cursorPosition;
                    QPalette::QPalette(&QStack_4c0,&context->palette);
                    qStack_4a8 = (context->clip).yp;
                    local_4a0 = (context->clip).w;
                    qStack_498 = (context->clip).h;
                    local_4b0 = SUB84(clip->xp,0);
                    uStack_4ac = (undefined4)((ulong)clip->xp >> 0x20);
                    local_490.d = (context->selections).d.d;
                    local_490.ptr = (context->selections).d.ptr;
                    local_490.size = (context->selections).d.size;
                    if (local_490.d != (Data *)0x0) {
                      LOCK();
                      ((local_490.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_490.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                    adjustContextSelectionsForCell
                              ((PaintContext *)&row_start,(QTextTableCell *)&num_rows,col,c,
                               (int *)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr)
                    ;
                    local_538 = 0xffffffff;
                    uStack_534 = 0xffffffff;
                    uStack_530 = 0xffffffff;
                    uStack_52c = 0xffffffff;
                    _col_start = (QTextFrame *)0xffffffffffffffff;
                    dStack_540 = -NAN;
                    QTextTableData::cellRect
                              ((QRectF *)&col_start,this_01,(QTextTableCell *)&num_rows);
                    _col_start = (QTextFrame *)(local_4d8.xp + (double)_col_start);
                    dStack_540 = (double)(int)((iVar33 * uVar24 + iVar3 + iVar4 + iVar5) - iVar6) *
                                 0.015625 + dStack_540;
                    cellRect.w._4_4_ = uStack_534;
                    cellRect.w._0_4_ = local_538;
                    cellRect.h._4_4_ = uStack_52c;
                    cellRect.h._0_4_ = uStack_530;
                    cellRect.yp._0_4_ = SUB84(dStack_540,0);
                    cellRect.xp = (qreal)_col_start;
                    cellRect.yp._4_4_ = (int)((ulong)dStack_540 >> 0x20);
                    bVar14 = cellClipTest(this_00,this_01,(PaintContext *)&row_start,
                                          (QTextTableCell *)&num_rows,cellRect);
                    if (!bVar14) {
                      drawTableCell(this,(QRectF *)&col_start,painter,(PaintContext *)&row_start,
                                    this_00,this_01,col,c,&local_468,&local_4f8);
                    }
                    QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer
                              (&local_490);
                    QPalette::~QPalette(&QStack_4c0);
                    c = c + 1;
                  } while (iVar15 != c);
                }
                col = col + 1;
              } while (col != iVar18);
            }
          } while (iVar33 != iVar25 >> 6);
        }
        uVar34 = 0;
        local_588 = uVar16;
        if ((0.0 < (context->clip).w) && (dVar36 = (context->clip).h, 0.0 < dVar36)) {
          pQVar9 = (this_01->rowPositions).d.ptr;
          uVar32 = (this_01->rowPositions).d.size;
          pQVar1 = pQVar9 + uVar32;
          dVar38 = (context->clip).yp;
          pQVar28 = pQVar9;
          if (0 < (long)uVar32) {
            uVar34 = uVar32;
            do {
              uVar31 = uVar34 >> 1;
              uVar34 = ~uVar31 + uVar34;
              pQVar13 = pQVar28 + uVar31 + 1;
              if ((int)((dVar38 - local_4d8.yp) * 64.0) <= pQVar28[uVar31].val) {
                uVar34 = uVar31;
                pQVar13 = pQVar28;
              }
              pQVar28 = pQVar13;
            } while (0 < (long)uVar34);
          }
          uVar34 = (ulong)((long)pQVar28 + (-4 - (long)pQVar9)) >> 2 & 0xffffffff;
          if (pQVar28 == pQVar9) {
            uVar34 = 0;
          }
          if (pQVar28 == pQVar1) {
            uVar34 = 0;
          }
          pQVar28 = pQVar9;
          if (0 < (long)uVar32) {
            do {
              uVar31 = uVar32 >> 1;
              uVar32 = ~uVar31 + uVar32;
              pQVar13 = pQVar28 + uVar31 + 1;
              if ((int)(((dVar36 + dVar38) - local_4d8.yp) * 64.0) < pQVar28[uVar31].val) {
                uVar32 = uVar31;
                pQVar13 = pQVar28;
              }
              pQVar28 = pQVar13;
            } while (0 < (long)uVar32);
          }
          local_588 = (uint)((ulong)((long)pQVar28 + (4 - (long)pQVar9)) >> 2);
          if (pQVar28 == pQVar1) {
            local_588 = uVar16;
          }
        }
        if (0 < iVar15) {
          iVar33 = 0;
          do {
            _row_start = (totally_ordered_wrapper<QTextFormatPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
            QStack_4c0.d._0_4_ = -0x55555556;
            QStack_4c0.d._4_4_ = -0x55555556;
            QTextTable::cellAt((QTextTable *)&row_start,iVar19,(int)uVar34);
            uVar16 = QTextTableCell::row((QTextTableCell *)&row_start);
            uVar32 = (ulong)uVar16;
            if ((int)uVar34 < (int)uVar16) {
              uVar32 = uVar34;
            }
            uVar34 = uVar32;
            iVar33 = iVar33 + 1;
          } while (iVar15 != iVar33);
        }
        if ((int)uVar34 < (int)local_588) {
          do {
            iVar33 = (int)uVar34;
            if (0 < iVar15) {
              iVar25 = 0;
              do {
                num_rows = -0x55555556;
                uStack_474 = 0xaaaaaaaa;
                iStack_470 = -0x55555556;
                uStack_46c = 0xaaaaaaaa;
                QTextTable::cellAt((QTextTable *)&num_rows,iVar19,iVar33);
                puVar29 = &DAT_006bc760;
                pPVar30 = (PaintContext *)&row_start;
                for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
                  *(undefined8 *)pPVar30 = *puVar29;
                  puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
                  pPVar30 = (PaintContext *)((long)pPVar30 + (ulong)bVar35 * -0x10 + 8);
                }
                row_start = context->cursorPosition;
                QPalette::QPalette(&QStack_4c0,&context->palette);
                qStack_4a8 = (context->clip).yp;
                local_4a0 = (context->clip).w;
                qStack_498 = (context->clip).h;
                local_4b0 = SUB84(clip->xp,0);
                uStack_4ac = (undefined4)((ulong)clip->xp >> 0x20);
                local_490.d = (context->selections).d.d;
                local_490.ptr = (context->selections).d.ptr;
                local_490.size = (context->selections).d.size;
                if (local_490.d != (Data *)0x0) {
                  LOCK();
                  ((local_490.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_490.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                       + 1;
                  UNLOCK();
                }
                adjustContextSelectionsForCell
                          ((PaintContext *)&row_start,(QTextTableCell *)&num_rows,iVar33,iVar25,
                           (int *)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr);
                local_538 = 0xffffffff;
                uStack_534 = 0xffffffff;
                uStack_530 = 0xffffffff;
                uStack_52c = 0xffffffff;
                _col_start = (QTextFrame *)0xffffffffffffffff;
                dStack_540 = -NAN;
                QTextTableData::cellRect((QRectF *)&col_start,this_01,(QTextTableCell *)&num_rows);
                _col_start = (QTextFrame *)(local_4d8.xp + (double)_col_start);
                dStack_540 = local_4d8.yp + dStack_540;
                cellRect_00.w._4_4_ = uStack_534;
                cellRect_00.w._0_4_ = local_538;
                cellRect_00.h._4_4_ = uStack_52c;
                cellRect_00.h._0_4_ = uStack_530;
                cellRect_00.yp._0_4_ = SUB84(dStack_540,0);
                cellRect_00.xp = (qreal)_col_start;
                cellRect_00.yp._4_4_ = (int)((ulong)dStack_540 >> 0x20);
                bVar14 = cellClipTest(this_00,this_01,(PaintContext *)&row_start,
                                      (QTextTableCell *)&num_rows,cellRect_00);
                if (!bVar14) {
                  drawTableCell(this,(QRectF *)&col_start,painter,(PaintContext *)&row_start,this_00
                                ,this_01,iVar33,iVar25,&local_468,&local_4f8);
                }
                QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer
                          (&local_490);
                QPalette::~QPalette(&QStack_4c0);
                iVar25 = iVar25 + 1;
              } while (iVar15 != iVar25);
            }
            uVar34 = (ulong)(iVar33 + 1U);
          } while (iVar33 + 1U != local_588);
        }
        if ((QVLAStorage<4UL,_4UL,_256LL> *)
            selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr !=
            &selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>) {
          QtPrivate::sizedFree
                    (selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr,
                     CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_,
                              (undefined4)
                              selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a) << 2);
        }
      }
      bVar14 = QTextBlock::isValid(&local_468);
      if (bVar14) {
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._0_4_ = 0xaaaaaaaa;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_ = 0xaaaaaaaa;
        p = QPainter::pen(painter);
        QPen::QPen((QPen *)&selectedTableCells,p);
        pQVar23 = QPalette::brush(&context->palette,Current,Text);
        QPainter::setPen(painter,&((pQVar23->d)._M_t.
                                   super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                   super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                   super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->color);
        iVar15 = context->cursorPosition;
        iVar33 = QTextBlock::position(&local_468);
        this_02 = QTextBlock::layout(&local_468);
        QTextLayout::drawCursor(this_02,painter,&local_4f8,iVar15 - iVar33,this->cursorWidth);
        QPainter::setPen(painter,(QPen *)&selectedTableCells);
        QPen::~QPen((QPen *)&selectedTableCells);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar7) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawFrame(const QPointF &offset, QPainter *painter,
                                           const QAbstractTextDocumentLayout::PaintContext &context,
                                           QTextFrame *frame) const
{
    QTextFrameData *fd = data(frame);
    // #######
    if (fd->layoutDirty)
        return;
    Q_ASSERT(!fd->sizeDirty);
    Q_ASSERT(!fd->layoutDirty);

    // floor the offset to avoid painting artefacts when drawing adjacent borders
    // we later also round table cell heights and widths
    const QPointF off = QPointF(QPointF(offset + fd->position.toPointF()).toPoint());

    if (context.clip.isValid()
        && (off.y() > context.clip.bottom() || off.y() + fd->size.height.toReal() < context.clip.top()
            || off.x() > context.clip.right() || off.x() + fd->size.width.toReal() < context.clip.left()))
        return;

     qCDebug(lcDraw) << "drawFrame" << frame->firstPosition() << "--" << frame->lastPosition() << "at" << offset;

    // if the cursor is /on/ a table border we may need to repaint it
    // afterwards, as we usually draw the decoration first
    QTextBlock cursorBlockNeedingRepaint;
    QPointF offsetOfRepaintedCursorBlock = off;

    QTextTable *table = qobject_cast<QTextTable *>(frame);
    const QRectF frameRect(off, fd->size.toSizeF());

    if (table) {
        const int rows = table->rows();
        const int columns = table->columns();
        QTextTableData *td = static_cast<QTextTableData *>(data(table));

        QVarLengthArray<int> selectedTableCells(context.selections.size() * 4);
        for (int i = 0; i < context.selections.size(); ++i) {
            const QAbstractTextDocumentLayout::Selection &s = context.selections.at(i);
            int row_start = -1, col_start = -1, num_rows = -1, num_cols = -1;

            if (s.cursor.currentTable() == table)
                s.cursor.selectedTableCells(&row_start, &num_rows, &col_start, &num_cols);

            selectedTableCells[i * 4] = row_start;
            selectedTableCells[i * 4 + 1] = col_start;
            selectedTableCells[i * 4 + 2] = num_rows;
            selectedTableCells[i * 4 + 3] = num_cols;
        }

        QFixed pageHeight = QFixed::fromReal(document->pageSize().height());
        if (pageHeight <= 0)
            pageHeight = QFIXED_MAX;

        QFixed absYPos = td->position.y;
        QTextFrame *parentFrame = table->parentFrame();
        while (parentFrame) {
            absYPos += data(parentFrame)->position.y;
            parentFrame = parentFrame->parentFrame();
        }
        const int tableStartPage = (absYPos / pageHeight).truncate();
        const int tableEndPage = ((absYPos + td->size.height) / pageHeight).truncate();

        // for borderCollapse draw frame decoration by drawing the outermost
        // cell edges with width = td->border
        if (!td->borderCollapse)
            drawFrameDecoration(painter, frame, fd, context.clip, frameRect);

        // draw the repeated table headers for table continuation after page breaks
        const int headerRowCount = qMin(table->format().headerRowCount(), rows - 1);
        int page = tableStartPage + 1;
        while (page <= tableEndPage) {
            const QFixed pageTop = page * pageHeight + td->effectiveTopMargin + td->cellSpacing + td->border;
            const qreal headerOffset = (pageTop - td->rowPositions.at(0)).toReal();
            for (int r = 0; r < headerRowCount; ++r) {
                for (int c = 0; c < columns; ++c) {
                    QTextTableCell cell = table->cellAt(r, c);
                    QAbstractTextDocumentLayout::PaintContext cell_context = context;
                    adjustContextSelectionsForCell(cell_context, cell, r, c, selectedTableCells.data());
                    QRectF cellRect = td->cellRect(cell);

                    cellRect.translate(off.x(), headerOffset);
                    if (cellClipTest(table, td, cell_context, cell, cellRect))
                        continue;

                    drawTableCell(cellRect, painter, cell_context, table, td, r, c, &cursorBlockNeedingRepaint,
                                  &offsetOfRepaintedCursorBlock);
                }
            }
            ++page;
        }

        int firstRow = 0;
        int lastRow = rows;

        if (context.clip.isValid()) {
            auto rowIt = std::lower_bound(td->rowPositions.constBegin(), td->rowPositions.constEnd(), QFixed::fromReal(context.clip.top() - off.y()));
            if (rowIt != td->rowPositions.constEnd() && rowIt != td->rowPositions.constBegin()) {
                --rowIt;
                firstRow = rowIt - td->rowPositions.constBegin();
            }

            rowIt = std::upper_bound(td->rowPositions.constBegin(), td->rowPositions.constEnd(), QFixed::fromReal(context.clip.bottom() - off.y()));
            if (rowIt != td->rowPositions.constEnd()) {
                ++rowIt;
                lastRow = rowIt - td->rowPositions.constBegin();
            }
        }

        for (int c = 0; c < columns; ++c) {
            QTextTableCell cell = table->cellAt(firstRow, c);
            firstRow = qMin(firstRow, cell.row());
        }

        for (int r = firstRow; r < lastRow; ++r) {
            for (int c = 0; c < columns; ++c) {
                QTextTableCell cell = table->cellAt(r, c);
                QAbstractTextDocumentLayout::PaintContext cell_context = context;
                adjustContextSelectionsForCell(cell_context, cell, r, c, selectedTableCells.data());
                QRectF cellRect = td->cellRect(cell);

                cellRect.translate(off);
                if (cellClipTest(table, td, cell_context, cell, cellRect))
                    continue;

                drawTableCell(cellRect, painter, cell_context, table, td, r, c, &cursorBlockNeedingRepaint,
                              &offsetOfRepaintedCursorBlock);
            }
        }

    } else {
        drawFrameDecoration(painter, frame, fd, context.clip, frameRect);

        QTextFrame::Iterator it = frame->begin();

        if (frame == docPrivate->rootFrame())
            it = frameIteratorForYPosition(QFixed::fromReal(context.clip.top()));

        QList<QTextFrame *> floats;
        const int numFloats = fd->floats.size();
        floats.reserve(numFloats);
        for (int i = 0; i < numFloats; ++i)
            floats.append(fd->floats.at(i));

        drawFlow(off, painter, context, it, floats, &cursorBlockNeedingRepaint);
    }

    if (cursorBlockNeedingRepaint.isValid()) {
        const QPen oldPen = painter->pen();
        painter->setPen(context.palette.color(QPalette::Text));
        const int cursorPos = context.cursorPosition - cursorBlockNeedingRepaint.position();
        cursorBlockNeedingRepaint.layout()->drawCursor(painter, offsetOfRepaintedCursorBlock,
                                                       cursorPos, cursorWidth);
        painter->setPen(oldPen);
    }

    return;
}